

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O3

string * __thiscall
cmFindPathCommand::FindHeaderInFramework
          (string *__return_storage_ptr__,cmFindPathCommand *this,string *file,string *dir,
          cmFindBaseDebugState *debug)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  string *path;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string glob;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string frameWorkName;
  string fileName;
  Glob globIt;
  string local_170;
  undefined1 local_150 [32];
  cmFindPathCommand *local_130;
  undefined1 *local_128;
  size_type local_120;
  undefined1 local_118;
  undefined7 uStack_117;
  pointer local_108;
  size_type local_100;
  undefined1 local_f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  string local_c8;
  string local_a8;
  undefined1 local_88 [16];
  undefined1 local_78 [32];
  size_type local_58;
  pointer local_50;
  pointer local_48;
  
  local_108 = (pointer)local_f8;
  pcVar3 = (file->_M_dataplus)._M_p;
  local_130 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar3,pcVar3 + file->_M_string_length);
  local_128 = &local_118;
  local_120 = 0;
  local_118 = 0;
  lVar5 = std::__cxx11::string::find((char)(string *)&local_108,0x2f);
  if (lVar5 != -1) {
    std::__cxx11::string::substr((ulong)local_88,(ulong)&local_108);
    std::__cxx11::string::operator=((string *)&local_108,(string *)local_88);
    if ((GlobInternals *)local_88._0_8_ != (GlobInternals *)local_78) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
    }
    std::__cxx11::string::_M_assign((string *)&local_128);
    std::__cxx11::string::substr((ulong)local_88,(ulong)&local_128);
    std::__cxx11::string::operator=((string *)&local_128,(string *)local_88);
    if ((GlobInternals *)local_88._0_8_ != (GlobInternals *)local_78) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
    }
    lVar5 = std::__cxx11::string::find((char)&local_128,0x2f);
    if (lVar5 != -1) {
      std::__cxx11::string::_M_assign((string *)&local_108);
      local_120 = 0;
      *local_128 = 0;
    }
    if (local_120 != 0) {
      local_88._8_8_ = (dir->_M_dataplus)._M_p;
      local_88._0_8_ = dir->_M_string_length;
      local_78._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_78._8_8_ = local_120;
      local_78._16_8_ = local_128;
      local_78._24_8_ = 0;
      local_58._0_1_ = true;
      local_58._1_3_ = 0;
      local_58._4_4_ = 0;
      local_50 = (pointer)0x891c91;
      local_48 = (pointer)0x0;
      views._M_len = 3;
      views._M_array = (iterator)local_88;
      cmCatViews(&local_170,views);
      local_88._0_8_ = local_170._M_string_length;
      local_88._8_8_ = local_170._M_dataplus._M_p;
      local_78._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_78._8_8_ = 9;
      local_78._16_8_ = (long)"*.framework/Headers/" + 0xb;
      local_78._24_8_ = 0;
      local_58 = local_100;
      local_50 = local_108;
      local_48 = (pointer)0x0;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_88;
      cmCatViews((string *)local_150,views_00);
      bVar4 = cmsys::SystemTools::FileExists((string *)local_150);
      if (bVar4) {
        path = &local_170;
        if (local_130->IncludeFileInPath != false) {
          path = (string *)local_150;
        }
        bVar4 = cmFindBase::Validate(&local_130->super_cmFindBase,path);
        if (bVar4) {
          local_a8._M_string_length = 0;
          local_a8.field_2._M_local_buf[0] = '\0';
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          cmFindBaseDebugState::FoundAt(debug,(string *)local_150,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
          bVar4 = local_130->IncludeFileInPath;
          paVar1 = &__return_storage_ptr__->field_2;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
          if (bVar4 == true) {
            if ((string *)local_150._0_8_ == (string *)(local_150 + 0x10)) {
              paVar1->_M_allocated_capacity = local_150._16_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_150._24_8_;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_150._0_8_;
              (__return_storage_ptr__->field_2)._M_allocated_capacity = local_150._16_8_;
            }
            __return_storage_ptr__->_M_string_length = local_150._8_8_;
          }
          else {
            paVar2 = &local_170.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p == paVar2) {
              paVar1->_M_allocated_capacity =
                   CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                            local_170.field_2._M_local_buf[0]);
              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_170.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = local_170._M_dataplus._M_p;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                            local_170.field_2._M_local_buf[0]);
            }
            __return_storage_ptr__->_M_string_length = local_170._M_string_length;
            local_170._M_string_length = 0;
            local_170.field_2._M_local_buf[0] = '\0';
            local_170._M_dataplus._M_p = (pointer)paVar2;
            if ((string *)local_150._0_8_ != (string *)(local_150 + 0x10)) {
              operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
            }
          }
          goto LAB_003ebd34;
        }
      }
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      cmFindBaseDebugState::FailedAt(debug,(string *)local_150,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
      if ((string *)local_150._0_8_ != (string *)(local_150 + 0x10)) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,
                        CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                                 local_170.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  local_88._8_8_ = (dir->_M_dataplus)._M_p;
  local_88._0_8_ = dir->_M_string_length;
  local_78._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78._8_8_ = 0x14;
  local_78._16_8_ = "*.framework/Headers/";
  local_78._24_8_ = 0;
  local_50 = (pointer)(file->_M_dataplus)._M_p;
  local_58 = file->_M_string_length;
  local_48 = (pointer)0x0;
  views_01._M_len = 3;
  views_01._M_array = (iterator)local_88;
  cmCatViews(&local_170,views_01);
  cmsys::Glob::Glob((Glob *)local_88);
  cmsys::Glob::FindFiles((Glob *)local_88,&local_170,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_150,__x);
  if (local_150._0_8_ == local_150._8_8_) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,(string *)local_150._0_8_);
    local_f8._24_8_ = 0;
    local_d8._M_local_buf[0] = '\0';
    local_f8._16_8_ = &local_d8;
    cmFindBaseDebugState::FoundAt(debug,__return_storage_ptr__,(string *)(local_f8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._16_8_ != &local_d8) {
      operator_delete((void *)local_f8._16_8_,
                      CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
    }
    if (local_130->IncludeFileInPath == false) {
      std::__cxx11::string::resize
                ((ulong)__return_storage_ptr__,
                 (char)__return_storage_ptr__->_M_string_length - (char)file->_M_string_length);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_150);
  cmsys::Glob::~Glob((Glob *)local_88);
LAB_003ebd34:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  if (local_108 != (pointer)local_f8) {
    operator_delete(local_108,(ulong)(local_f8._0_8_ + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindHeaderInFramework(
  std::string const& file, std::string const& dir,
  cmFindBaseDebugState& debug) const
{
  std::string fileName = file;
  std::string frameWorkName;
  std::string::size_type pos = fileName.find('/');
  // if there is a / in the name try to find the header as a framework
  // For example bar/foo.h would look for:
  // bar.framework/Headers/foo.h
  if (pos != std::string::npos) {
    // remove the name from the slash;
    fileName = fileName.substr(pos + 1);
    frameWorkName = file;
    frameWorkName =
      frameWorkName.substr(0, frameWorkName.size() - fileName.size() - 1);
    // if the framework has a path in it then just use the filename
    if (frameWorkName.find('/') != std::string::npos) {
      fileName = file;
      frameWorkName.clear();
    }
    if (!frameWorkName.empty()) {
      std::string fpath = cmStrCat(dir, frameWorkName, ".framework");
      std::string intPath = cmStrCat(fpath, "/Headers/", fileName);
      if (cmSystemTools::FileExists(intPath) &&
          this->Validate(this->IncludeFileInPath ? intPath : fpath)) {
        debug.FoundAt(intPath);
        if (this->IncludeFileInPath) {
          return intPath;
        }
        return fpath;
      }
      debug.FailedAt(intPath);
    }
  }
  // if it is not found yet or not a framework header, then do a glob search
  // for all frameworks in the directory: dir/*.framework/Headers/<file>
  std::string glob = cmStrCat(dir, "*.framework/Headers/", file);
  cmsys::Glob globIt;
  globIt.FindFiles(glob);
  std::vector<std::string> files = globIt.GetFiles();
  if (!files.empty()) {
    std::string fheader = cmSystemTools::CollapseFullPath(files[0]);
    debug.FoundAt(fheader);
    if (this->IncludeFileInPath) {
      return fheader;
    }
    fheader.resize(fheader.size() - file.size());
    return fheader;
  }

  // No frameworks matched the glob, so nothing more to add to debug.FailedAt()
  return "";
}